

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O2

void ncnn::im2col_sgemm_pack8to1_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint _c;
  undefined8 uVar18;
  int *piVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  int iVar24;
  int iVar25;
  char *kptr0;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  undefined4 *puVar29;
  undefined4 *puVar30;
  undefined4 *puVar31;
  int q;
  ulong uVar32;
  long lVar33;
  undefined4 *puVar34;
  undefined8 *puVar35;
  undefined8 *puVar36;
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  int iVar39;
  bool bVar40;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 local_88 [64];
  size_t local_48;
  long local_40;
  void *local_38;
  
  uVar2 = bottom_im2col->w;
  uVar37 = (ulong)(int)uVar2;
  iVar39 = bottom_im2col->h;
  uVar21 = bottom_im2col->c;
  iVar3 = top_blob->c;
  local_48 = 0;
  local_88._16_8_ = 0;
  local_88._24_4_ = 0;
  local_88._0_8_ = (undefined1 (*) [16])0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_88._32_8_ = (Allocator *)0x0;
  local_88._40_4_ = 0;
  local_88._44_4_ = 0;
  _c = (uVar2 & 1) + (uVar2 >> 1);
  if ((long)uVar37 < 2) {
    _c = uVar2;
  }
  Mat::create((Mat *)local_88,iVar39 << (1 < (long)uVar37),uVar21,_c,8,8,opt->workspace_allocator);
  uVar20 = 0;
  iVar24 = 0;
  if (0 < iVar39) {
    iVar24 = iVar39;
  }
  uVar28 = 0;
  if (0 < (int)uVar21) {
    uVar28 = (ulong)uVar21;
  }
  uVar26 = (ulong)(uint)((int)uVar2 >> 1);
  if ((int)uVar2 >> 1 < 1) {
    uVar26 = uVar20;
  }
  for (uVar22 = 0; uVar22 != uVar26; uVar22 = uVar22 + 1) {
    puVar35 = (undefined8 *)((undefined1 *)local_88._0_8_ + local_48 * uVar22 * local_88._16_8_);
    for (uVar32 = 0; uVar32 != uVar28; uVar32 = uVar32 + 1) {
      puVar36 = (undefined8 *)
                ((long)bottom_im2col->data +
                bottom_im2col->cstep * bottom_im2col->elemsize * uVar32 + uVar20);
      iVar25 = iVar24;
      while (bVar40 = iVar25 != 0, iVar25 = iVar25 + -1, bVar40) {
        uVar18 = puVar36[1];
        *puVar35 = *puVar36;
        puVar35[1] = uVar18;
        puVar35 = puVar35 + 2;
        puVar36 = puVar36 + uVar37;
      }
    }
    uVar20 = uVar20 + 0x10;
  }
  uVar20 = uVar37 & 0xfffffffffffffffe;
  lVar33 = uVar20 * 8;
  for (; (long)uVar20 < (long)uVar37; uVar20 = uVar20 + 1) {
    uVar26 = (ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff;
    puVar35 = (undefined8 *)
              ((undefined1 *)local_88._0_8_ +
              (long)((int)((long)uVar26 % 2) + (int)((long)uVar26 / 2)) * local_48 * local_88._16_8_
              );
    pvVar4 = bottom_im2col->data;
    for (uVar26 = 0; uVar26 != uVar28; uVar26 = uVar26 + 1) {
      puVar36 = (undefined8 *)
                ((long)pvVar4 + bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + lVar33);
      iVar25 = iVar24;
      while (bVar40 = iVar25 != 0, iVar25 = iVar25 + -1, bVar40) {
        *puVar35 = *puVar36;
        puVar35 = puVar35 + 1;
        puVar36 = puVar36 + uVar37;
      }
    }
    lVar33 = lVar33 + 8;
  }
  local_38 = top_blob->data;
  local_40 = top_blob->elemsize * top_blob->cstep;
  uVar28 = 0;
  uVar20 = (ulong)(uVar21 * iVar39);
  if ((int)(uVar21 * iVar39) < 1) {
    uVar20 = uVar28;
  }
  uVar26 = (ulong)(uint)(iVar3 >> 2);
  if (iVar3 >> 2 < 1) {
    uVar26 = uVar28;
  }
  do {
    iVar39 = (int)uVar20;
    if (uVar28 == uVar26) {
      sVar5 = top_blob->elemsize;
      sVar6 = top_blob->cstep;
      pvVar4 = top_blob->data;
      for (uVar20 = (long)iVar3 & 0xfffffffffffffffc; (long)uVar20 < (long)iVar3;
          uVar20 = uVar20 + 1) {
        uVar28 = (ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff;
        lVar33 = (long)((int)((long)uVar28 % 4) + (int)((long)uVar28 / 4));
        sVar7 = kernel->cstep;
        sVar8 = kernel->elemsize;
        puVar35 = (undefined8 *)(sVar5 * sVar6 * uVar20 + (long)pvVar4);
        pvVar9 = kernel->data;
        for (uVar28 = 0; (long)(uVar28 | 1) < (long)uVar37; uVar28 = uVar28 + 2) {
          pauVar23 = (undefined1 (*) [16])
                     ((undefined1 *)local_88._0_8_ + (uVar28 >> 1) * local_88._16_8_ * local_48);
          auVar41 = ZEXT1664((undefined1  [16])0x0);
          lVar27 = 0;
          auVar42 = ZEXT1664((undefined1  [16])0x0);
          auVar43 = ZEXT1664((undefined1  [16])0x0);
          auVar44 = ZEXT1664((undefined1  [16])0x0);
          while( true ) {
            if (iVar39 == (int)lVar27) break;
            auVar1 = *pauVar23;
            auVar10 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            auVar13 = vpunpcklbw_avx(auVar1,auVar10);
            auVar11 = vpunpckhbw_avx(auVar1,auVar10);
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *(ulong *)((long)pvVar9 + lVar27 * 8 + sVar7 * lVar33 * sVar8);
            auVar1 = vpmovsxbw_avx(auVar1);
            auVar12 = vpmullw_avx(auVar13,auVar1);
            auVar10 = vpmulhw_avx(auVar13,auVar1);
            auVar13 = vpmullw_avx(auVar11,auVar1);
            auVar11 = vpmulhw_avx(auVar11,auVar1);
            auVar1 = vpunpcklwd_avx(auVar12,auVar10);
            auVar1 = vpaddd_avx(auVar41._0_16_,auVar1);
            auVar41 = ZEXT1664(auVar1);
            auVar1 = vpunpckhwd_avx(auVar12,auVar10);
            auVar1 = vpaddd_avx(auVar42._0_16_,auVar1);
            auVar42 = ZEXT1664(auVar1);
            auVar1 = vpunpcklwd_avx(auVar13,auVar11);
            auVar1 = vpaddd_avx(auVar43._0_16_,auVar1);
            auVar43 = ZEXT1664(auVar1);
            auVar1 = vpunpckhwd_avx(auVar13,auVar11);
            auVar1 = vpaddd_avx(auVar44._0_16_,auVar1);
            auVar44 = ZEXT1664(auVar1);
            pauVar23 = pauVar23 + 1;
            lVar27 = lVar27 + 1;
          }
          auVar1 = vpaddd_avx(auVar42._0_16_,auVar41._0_16_);
          auVar10 = vpaddd_avx(auVar44._0_16_,auVar43._0_16_);
          auVar11 = vpshufd_avx(auVar1,0xee);
          auVar1 = vpaddd_avx(auVar1,auVar11);
          auVar11 = vpshufd_avx(auVar10,0xee);
          auVar10 = vpaddd_avx(auVar10,auVar11);
          auVar1 = vphaddd_avx(auVar1,auVar10);
          auVar1 = vpshufd_avx(auVar1,0xe8);
          *puVar35 = auVar1._0_8_;
          puVar35 = puVar35 + 1;
        }
        sVar7 = kernel->cstep;
        sVar8 = kernel->elemsize;
        pvVar9 = kernel->data;
        while (uVar21 = (uint)uVar28, (int)uVar21 < (int)uVar2) {
          auVar41 = ZEXT1664((undefined1  [16])0x0);
          lVar27 = 0;
          auVar42 = ZEXT1664((undefined1  [16])0x0);
          while( true ) {
            if (iVar39 == (int)lVar27) break;
            auVar10._8_8_ = 0;
            auVar10._0_8_ =
                 *(ulong *)((undefined1 *)local_88._0_8_ +
                           lVar27 * 8 +
                           (ulong)((uVar21 & 1) + ((uint)(uVar28 >> 1) & 0x7fffffff)) *
                           local_88._16_8_ * local_48);
            auVar1 = vpmovsxbw_avx(auVar10);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)((long)pvVar9 + lVar27 * 8 + lVar33 * sVar7 * sVar8);
            auVar10 = vpmovsxbw_avx(auVar11);
            auVar11 = vpmullw_avx(auVar10,auVar1);
            auVar10 = vpmulhw_avx(auVar1,auVar10);
            auVar1 = vpunpcklwd_avx(auVar11,auVar10);
            auVar1 = vpaddd_avx(auVar41._0_16_,auVar1);
            auVar41 = ZEXT1664(auVar1);
            auVar1 = vpunpckhwd_avx(auVar11,auVar10);
            auVar1 = vpaddd_avx(auVar42._0_16_,auVar1);
            auVar42 = ZEXT1664(auVar1);
            lVar27 = lVar27 + 1;
          }
          auVar1 = vpaddd_avx(auVar42._0_16_,auVar41._0_16_);
          auVar1 = vphaddd_avx(auVar1,auVar1);
          auVar1 = vphaddd_avx(auVar1,auVar1);
          *(int *)puVar35 = auVar1._0_4_;
          puVar35 = (undefined8 *)((long)puVar35 + 4);
          uVar28 = (ulong)(uVar21 + 1);
        }
      }
      piVar19 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
            free((void *)local_88._0_8_);
          }
          else {
            (*(*(_func_int ***)local_88._32_8_)[3])();
          }
        }
      }
      return;
    }
    puVar29 = (undefined4 *)(uVar28 * 4 * local_40 + (long)local_38);
    puVar30 = (undefined4 *)((uVar28 * 4 + 1) * local_40 + (long)local_38);
    puVar31 = (undefined4 *)((uVar28 * 4 + 2) * local_40 + (long)local_38);
    puVar34 = (undefined4 *)((uVar28 * 4 + 3) * local_40 + (long)local_38);
    pauVar38 = (undefined1 (*) [16])(kernel->cstep * kernel->elemsize * uVar28 + (long)kernel->data)
    ;
    pauVar23 = (undefined1 (*) [16])local_88._0_8_;
    for (uVar22 = 0; (long)(uVar22 | 1) < (long)uVar37; uVar22 = uVar22 + 2) {
      if (iVar39 != 0) {
        auVar1 = *pauVar23;
        auVar10 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
        vpunpcklbw_avx(auVar1,auVar10);
        vpunpckhbw_avx(auVar1,auVar10);
        auVar1 = *pauVar38;
        auVar10 = pauVar38[1];
        auVar11 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
        auVar12 = vpcmpgtb_avx((undefined1  [16])0x0,auVar10);
        vpunpcklbw_avx(auVar1,auVar11);
        vpunpckhbw_avx(auVar1,auVar11);
        vpunpcklbw_avx(auVar10,auVar12);
        vpunpckhbw_avx(auVar10,auVar12);
        halt_baddata();
      }
      auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar14 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar10 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar11 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar15 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar16 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar12 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar13 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar17 = vpunpcklqdq_avx(auVar1,auVar14);
      auVar1 = vpunpckhqdq_avx(auVar1,auVar14);
      auVar1 = vpaddd_avx(auVar17,auVar1);
      auVar14 = vpunpcklqdq_avx(auVar10,auVar11);
      auVar10 = vpunpckhqdq_avx(auVar10,auVar11);
      auVar10 = vpaddd_avx(auVar10,auVar14);
      auVar1 = vpaddd_avx(auVar1,auVar10);
      auVar11 = vpunpcklqdq_avx(auVar15,auVar16);
      auVar10 = vpunpckhqdq_avx(auVar15,auVar16);
      auVar10 = vpaddd_avx(auVar11,auVar10);
      auVar11 = vpunpcklqdq_avx(auVar12,auVar13);
      *puVar29 = auVar1._0_4_;
      *puVar30 = auVar1._4_4_;
      *puVar31 = auVar1._8_4_;
      *puVar34 = auVar1._12_4_;
      auVar1 = vpunpckhqdq_avx(auVar12,auVar13);
      auVar1 = vpaddd_avx(auVar1,auVar11);
      auVar1 = vpaddd_avx(auVar10,auVar1);
      puVar29[1] = auVar1._0_4_;
      puVar30[1] = auVar1._4_4_;
      puVar31[1] = auVar1._8_4_;
      puVar34[1] = auVar1._12_4_;
      puVar29 = puVar29 + 2;
      puVar30 = puVar30 + 2;
      puVar31 = puVar31 + 2;
      puVar34 = puVar34 + 2;
      pauVar23 = (undefined1 (*) [16])(*pauVar23 + local_88._16_8_ * local_48);
    }
    pauVar23 = (undefined1 (*) [16])(kernel->cstep * uVar28 * kernel->elemsize + (long)kernel->data)
    ;
    while (uVar21 = (uint)uVar22, (int)uVar21 < (int)uVar2) {
      if (iVar39 != 0) {
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             *(ulong *)((undefined1 *)local_88._0_8_ +
                       (ulong)((uVar21 & 1) + ((uint)(uVar22 >> 1) & 0x7fffffff)) *
                       local_88._16_8_ * local_48);
        vpmovsxbw_avx(auVar12);
        auVar1 = *pauVar23;
        auVar10 = pauVar23[1];
        auVar11 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
        auVar12 = vpcmpgtb_avx((undefined1  [16])0x0,auVar10);
        vpunpcklbw_avx(auVar1,auVar11);
        vpunpckhbw_avx(auVar1,auVar11);
        vpunpcklbw_avx(auVar10,auVar12);
        vpunpckhbw_avx(auVar10,auVar12);
        halt_baddata();
      }
      auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar12 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar10 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar11 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar13 = vpunpcklqdq_avx(auVar1,auVar12);
      auVar1 = vpunpckhqdq_avx(auVar1,auVar12);
      auVar1 = vpaddd_avx(auVar13,auVar1);
      auVar12 = vpunpcklqdq_avx(auVar10,auVar11);
      auVar10 = vpunpckhqdq_avx(auVar10,auVar11);
      auVar10 = vpaddd_avx(auVar10,auVar12);
      auVar1 = vpaddd_avx(auVar1,auVar10);
      *puVar29 = auVar1._0_4_;
      *puVar30 = auVar1._4_4_;
      *puVar31 = auVar1._8_4_;
      *puVar34 = auVar1._12_4_;
      puVar29 = puVar29 + 1;
      puVar30 = puVar30 + 1;
      puVar31 = puVar31 + 1;
      puVar34 = puVar34 + 1;
      uVar22 = (ulong)(uVar21 + 1);
    }
    uVar28 = uVar28 + 1;
  } while( true );
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}